

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall
capnp::compiler::Compiler::Node::traverseBrand
          (Node *this,Reader *brand,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  ListElementCount LVar1;
  ElementCount index;
  ElementCount index_00;
  bool bVar2;
  Reader binding;
  Reader scope;
  StructReader local_148;
  StructReader local_118;
  PointerReader local_e8;
  ListReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  bVar2 = (brand->_reader).pointerCount == 0;
  local_118.data = (brand->_reader).pointers;
  if (bVar2) {
    local_118.data = (WirePointer *)0x0;
  }
  local_118.pointers._0_4_ = 0x7fffffff;
  if (!bVar2) {
    local_118.pointers._0_4_ = (brand->_reader).nestingLimit;
  }
  local_118.segment._0_4_ = 0;
  local_118.segment._4_4_ = 0;
  local_118.capTable._0_4_ = 0;
  local_118.capTable._4_4_ = 0;
  if (!bVar2) {
    local_118.segment._0_4_ = *(undefined4 *)&(brand->_reader).segment;
    local_118.segment._4_4_ = *(undefined4 *)((long)&(brand->_reader).segment + 4);
    local_118.capTable._0_4_ = *(undefined4 *)&(brand->_reader).capTable;
    local_118.capTable._4_4_ = *(undefined4 *)((long)&(brand->_reader).capTable + 4);
  }
  _::PointerReader::getList(&local_90,(PointerReader *)&local_118,INLINE_COMPOSITE,(word *)0x0);
  if (local_90.elementCount != 0) {
    index_00 = 0;
    do {
      _::ListReader::getStructElement(&local_118,&local_90,index_00);
      if ((local_118.dataSize < 0x50) ||
         ((short)(((WirePointer *)((long)local_118.data + 8))->offsetAndKind).value == 0)) {
        local_148.data = (void *)CONCAT44(local_118.pointers._4_4_,(int)local_118.pointers);
        local_148.pointers._0_4_ = local_118.nestingLimit;
        if (local_118.pointerCount == 0) {
          local_148.data = (short *)0x0;
          local_148.pointers._0_4_ = 0x7fffffff;
        }
        local_148.segment._0_4_ = 0;
        local_148.segment._4_4_ = 0;
        local_148.capTable._0_4_ = 0;
        local_148.capTable._4_4_ = 0;
        if (local_118.pointerCount != 0) {
          local_148.segment._0_4_ = local_118.segment._0_4_;
          local_148.segment._4_4_ = local_118.segment._4_4_;
          local_148.capTable._0_4_ = local_118.capTable._0_4_;
          local_148.capTable._4_4_ = local_118.capTable._4_4_;
        }
        _::PointerReader::getList
                  (&local_c0,(PointerReader *)&local_148,INLINE_COMPOSITE,(word *)0x0);
        LVar1 = local_c0.elementCount;
        if (local_c0.elementCount != 0) {
          index = 0;
          do {
            _::ListReader::getStructElement(&local_148,&local_c0,index);
            if ((0xf < local_148.dataSize) && (*local_148.data == 1)) {
              local_e8.pointer =
                   (WirePointer *)CONCAT44(local_148.pointers._4_4_,(int)local_148.pointers);
              local_e8.nestingLimit = local_148.nestingLimit;
              if (local_148.pointerCount == 0) {
                local_e8.pointer = (WirePointer *)0x0;
                local_e8.nestingLimit = 0x7fffffff;
              }
              local_e8.segment._0_4_ = 0;
              local_e8.segment._4_4_ = 0;
              local_e8.capTable._0_4_ = 0;
              local_e8.capTable._4_4_ = 0;
              if (local_148.pointerCount != 0) {
                local_e8.segment._0_4_ = local_148.segment._0_4_;
                local_e8.segment._4_4_ = local_148.segment._4_4_;
                local_e8.capTable._0_4_ = local_148.capTable._0_4_;
                local_e8.capTable._4_4_ = local_148.capTable._4_4_;
              }
              _::PointerReader::getStruct(&local_60,&local_e8,(word *)0x0);
              traverseType(this,(Reader *)&local_60,eagerness,seen,finalLoader,sourceInfo);
            }
            index = index + 1;
          } while (LVar1 != index);
        }
      }
      index_00 = index_00 + 1;
    } while (index_00 != local_90.elementCount);
  }
  return;
}

Assistant:

void Compiler::Node::traverseBrand(
    const schema::Brand::Reader& brand, uint eagerness,
    std::unordered_map<Node*, uint>& seen,
    const SchemaLoader& finalLoader,
    kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto scope: brand.getScopes()) {
    switch (scope.which()) {
      case schema::Brand::Scope::BIND:
        for (auto binding: scope.getBind()) {
          switch (binding.which()) {
            case schema::Brand::Binding::UNBOUND:
              break;
            case schema::Brand::Binding::TYPE:
              traverseType(binding.getType(), eagerness, seen, finalLoader, sourceInfo);
              break;
          }
        }
        break;
      case schema::Brand::Scope::INHERIT:
        break;
    }
  }
}